

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall flatbuffers::rust::RustGenerator::GenEnum(RustGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  IdlNamer *pIVar1;
  bool bVar2;
  Value *pVVar3;
  EnumVal *ev;
  EnumVal *ev_00;
  string *psVar4;
  char *__s;
  string deprecation_warning;
  string num_fields;
  string sStack_df8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  string local_db8;
  allocator<char> local_d92;
  allocator<char> local_d91;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if ((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_df8,"private",(allocator<char> *)&local_db8);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(enum_def->super_Definition).attributes,&sStack_df8);
    __s = "pub(crate)";
    if (pVVar3 == (Value *)0x0) {
      __s = "pub";
    }
    std::__cxx11::string::~string((string *)&sStack_df8);
  }
  else {
    __s = "pub";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_df8,"ACCESS_TYPE",(allocator<char> *)&local_dd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db8,__s,(allocator<char> *)&local_d90);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
  std::__cxx11::string::~string((string *)&local_db8);
  std::__cxx11::string::~string((string *)&sStack_df8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_df8,"ENUM_TY",(allocator<char> *)&local_dd8);
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_db8,pIVar1,enum_def);
  CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
  std::__cxx11::string::~string((string *)&local_db8);
  std::__cxx11::string::~string((string *)&sStack_df8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_df8,"BASE_TYPE",(allocator<char> *)&local_dd8);
  GetEnumTypeForDecl_abi_cxx11_(&local_db8,this,&enum_def->underlying_type);
  CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
  std::__cxx11::string::~string((string *)&local_db8);
  std::__cxx11::string::~string((string *)&sStack_df8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_df8,"ENUM_NAMESPACE",(allocator<char> *)&local_dd8);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_db8,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.namespaces);
  CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
  std::__cxx11::string::~string((string *)&local_db8);
  std::__cxx11::string::~string((string *)&sStack_df8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_df8,"ENUM_CONSTANT",(allocator<char> *)&local_dd8);
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_db8,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.constants);
  CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
  std::__cxx11::string::~string((string *)&local_db8);
  std::__cxx11::string::~string((string *)&sStack_df8);
  ev = EnumDef::MinValue(enum_def);
  ev_00 = EnumDef::MaxValue(enum_def);
  if ((ev != (EnumVal *)0x0) && (ev_00 != (EnumVal *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_df8,"ENUM_MIN_BASE_VALUE",(allocator<char> *)&local_dd8);
    EnumDef::ToString_abi_cxx11_(&local_db8,enum_def,ev);
    CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
    std::__cxx11::string::~string((string *)&local_db8);
    std::__cxx11::string::~string((string *)&sStack_df8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_df8,"ENUM_MAX_BASE_VALUE",(allocator<char> *)&local_dd8);
    EnumDef::ToString_abi_cxx11_(&local_db8,enum_def,ev_00);
    CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
    std::__cxx11::string::~string((string *)&local_db8);
    std::__cxx11::string::~string((string *)&sStack_df8);
    bVar2 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"#[allow(non_upper_case_globals)]",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"mod bitflags_{{ENUM_NAMESPACE}} {",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"  flatbuffers::bitflags::bitflags! {",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      GenComment(this,&(enum_def->super_Definition).doc_comment,"    ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"    #[derive(Default, Debug, Clone, Copy, PartialEq)]",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:732:35)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:732:35)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"    }",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"  }",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"}",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_df8,"INTO_BASE",(allocator<char> *)&local_dd8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_db8,"self.bits()",(allocator<char> *)&local_d90);
      CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_df8,
                 "#[deprecated(since = \"2.0.0\", note = \"Use associated constants instead. This will no longer be generated in 2021.\")]"
                 ,(allocator<char> *)&local_db8);
      std::__cxx11::string::string((string *)&local_230,(string *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,
                 "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};",
                 (allocator<char> *)&local_db8);
      CodeWriter::operator+=(this_00,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string((string *)&local_270,(string *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,
                 "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};",
                 (allocator<char> *)&local_db8);
      CodeWriter::operator+=(this_00,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      NumToString<unsigned_long>
                (&local_db8,
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      std::__cxx11::string::string((string *)&local_2b0,(string *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"#[allow(non_camel_case_types)]",(allocator<char> *)&local_dd8
                );
      CodeWriter::operator+=(this_00,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::operator+(&local_dd8,"pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; ",&local_db8
                    );
      std::operator+(&local_2f0,&local_dd8,"] = [");
      CodeWriter::operator+=(this_00,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_dd8);
      local_58 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:762:35)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:762:35)>
                 ::_M_manager;
      local_70._M_unused._M_object = this;
      local_70._8_8_ = enum_def;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_70);
      std::_Function_base::~_Function_base((_Function_base *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"];",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      GenComment(this,&(enum_def->super_Definition).doc_comment,"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,
                 "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, Default)]",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,"#[repr(transparent)]",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"#[allow(non_upper_case_globals)]",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"impl {{ENUM_TY}} {",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      local_90._8_8_ = 0;
      local_78 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:779:35)>
                 ::_M_invoke;
      local_80 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:779:35)>
                 ::_M_manager;
      local_90._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_90);
      std::_Function_base::~_Function_base((_Function_base *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,
                 "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,
                 "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"  pub const ENUM_VALUES: &\'static [Self] = &[",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      local_b0._8_8_ = 0;
      local_98 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:788:34)>
                 ::_M_invoke;
      local_a0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:788:34)>
                 ::_M_manager;
      local_b0._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_b0);
      std::_Function_base::~_Function_base((_Function_base *)&local_b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"  ];",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"  /// Returns the variant\'s name or \"\" if unknown.",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,"  pub fn variant_name(self) -> Option<&\'static str> {",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"    match self {",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      local_d0._8_8_ = 0;
      local_b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:793:34)>
                 ::_M_invoke;
      local_c0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:793:34)>
                 ::_M_manager;
      local_d0._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_d0);
      std::_Function_base::~_Function_base((_Function_base *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"      _ => None,",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"    }",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_530,"  }",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_550,"}",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_570,"impl core::fmt::Debug for {{ENUM_TY}} {",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_590,
                 "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5b0,"    if let Some(name) = self.variant_name() {",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"      f.write_str(name)",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_5d0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"    } else {",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_5f0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))",
                 (allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_630,"    }",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"  }",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_670,"}",(allocator<char> *)&local_dd8);
      CodeWriter::operator+=(this_00,&local_670);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_dd8,"INTO_BASE",&local_d91);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"self.0",&local_d92);
      CodeWriter::SetValue(this_00,&local_dd8,&local_d90);
      std::__cxx11::string::~string((string *)&local_d90);
      std::__cxx11::string::~string((string *)&local_dd8);
    }
    std::__cxx11::string::~string((string *)&local_db8);
    std::__cxx11::string::~string((string *)&sStack_df8);
    if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_690,"impl Serialize for {{ENUM_TY}} {",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b0,
                 "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6d0,"  where",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_6d0);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f0,"    S: Serializer,",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_6f0);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_710,"  {",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_710);
      std::__cxx11::string::~string((string *)&local_710);
      bVar2 = anon_unknown_26::IsBitFlagsEnum(enum_def);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_730,"    serializer.serialize_u32(self.bits() as u32)",
                   (allocator<char> *)&sStack_df8);
        CodeWriter::operator+=(this_00,&local_730);
        psVar4 = &local_730;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,
                   "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 as u32, self.variant_name().unwrap())"
                   ,(allocator<char> *)&sStack_df8);
        CodeWriter::operator+=(this_00,&local_750);
        psVar4 = &local_750;
      }
      std::__cxx11::string::~string((string *)psVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_770,"  }",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_790,"}",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_790);
      std::__cxx11::string::~string((string *)&local_790);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,"",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_7b0);
      std::__cxx11::string::~string((string *)&local_7b0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"impl<\'a> flatbuffers::Follow<\'a> for {{ENUM_TY}} {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_7d0);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"  type Inner = Self;",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_810,"  #[inline]",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_810);
    std::__cxx11::string::~string((string *)&local_810);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_830,
               "  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_830);
    std::__cxx11::string::~string((string *)&local_830);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,
               "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_850);
    std::__cxx11::string::~string((string *)&local_850);
    bVar2 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_870,"    Self::from_bits_retain(b)",(allocator<char> *)&sStack_df8
                );
      CodeWriter::operator+=(this_00,&local_870);
      psVar4 = &local_870;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,"    Self(b)",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_890);
      psVar4 = &local_890;
    }
    std::__cxx11::string::~string((string *)psVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b0,"  }",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_8b0);
    std::__cxx11::string::~string((string *)&local_8b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d0,"}",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_8d0);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_8f0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_910,"impl flatbuffers::Push for {{ENUM_TY}} {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_910);
    std::__cxx11::string::~string((string *)&local_910);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"    type Output = {{ENUM_TY}};",(allocator<char> *)&sStack_df8)
    ;
    CodeWriter::operator+=(this_00,&local_930);
    std::__cxx11::string::~string((string *)&local_930);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_950,"    #[inline]",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,
               "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_990,
               "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, {{INTO_BASE}});",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_990);
    std::__cxx11::string::~string((string *)&local_990);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b0,"    }",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_9b0);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d0,"}",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_9d0);
    std::__cxx11::string::~string((string *)&local_9d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f0,"",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_9f0);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,"impl flatbuffers::EndianScalar for {{ENUM_TY}} {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_a10);
    std::__cxx11::string::~string((string *)&local_a10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"  type Scalar = {{BASE_TYPE}};",(allocator<char> *)&sStack_df8)
    ;
    CodeWriter::operator+=(this_00,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"  #[inline]",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_a50);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"  fn to_little_endian(self) -> {{BASE_TYPE}} {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_a70);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"    {{INTO_BASE}}.to_le()",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ab0,"  }",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_ab0);
    std::__cxx11::string::~string((string *)&local_ab0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad0,"  #[inline]",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_ad0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af0,"  #[allow(clippy::wrong_self_convention)]",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_af0);
    std::__cxx11::string::~string((string *)&local_af0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b10,"  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_b10);
    std::__cxx11::string::~string((string *)&local_b10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b30,"    let b = {{BASE_TYPE}}::from_le(v);",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_b30);
    std::__cxx11::string::~string((string *)&local_b30);
    bVar2 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b50,"    Self::from_bits_retain(b)",(allocator<char> *)&sStack_df8
                );
      CodeWriter::operator+=(this_00,&local_b50);
      psVar4 = &local_b50;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b70,"    Self(b)",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_b70);
      psVar4 = &local_b70;
    }
    std::__cxx11::string::~string((string *)psVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b90,"  }",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_b90);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb0,"}",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_bb0);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bd0,"",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_bd0);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bf0,"impl<\'a> flatbuffers::Verifiable for {{ENUM_TY}} {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_bf0);
    std::__cxx11::string::~string((string *)&local_bf0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c10,"  #[inline]",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_c10);
    std::__cxx11::string::~string((string *)&local_c10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c30,"  fn run_verifier(",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_c30);
    std::__cxx11::string::~string((string *)&local_c30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c50,"    v: &mut flatbuffers::Verifier, pos: usize",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_c50);
    std::__cxx11::string::~string((string *)&local_c50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c70,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_c70);
    std::__cxx11::string::~string((string *)&local_c70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c90,"    use self::flatbuffers::Verifiable;",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_c90);
    std::__cxx11::string::~string((string *)&local_c90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cb0,"    {{BASE_TYPE}}::run_verifier(v, pos)",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_cb0);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd0,"  }",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_cd0);
    std::__cxx11::string::~string((string *)&local_cd0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cf0,"}",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_cf0);
    std::__cxx11::string::~string((string *)&local_cf0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d10,"",(allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_d10);
    std::__cxx11::string::~string((string *)&local_d10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d30,"impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}",
               (allocator<char> *)&sStack_df8);
    CodeWriter::operator+=(this_00,&local_d30);
    std::__cxx11::string::~string((string *)&local_d30);
    if (enum_def->is_union == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_df8,"UNION_TYPE",(allocator<char> *)&local_dd8);
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_db8,pIVar1,enum_def);
      CodeWriter::SetValue(this_00,&sStack_df8,&local_db8);
      std::__cxx11::string::~string((string *)&local_db8);
      std::__cxx11::string::~string((string *)&sStack_df8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d50,"{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}",
                 (allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_d50);
      std::__cxx11::string::~string((string *)&local_d50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d70,"",(allocator<char> *)&sStack_df8);
      CodeWriter::operator+=(this_00,&local_d70);
      std::__cxx11::string::~string((string *)&local_d70);
      if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
        GenUnionObject(this,enum_def);
      }
    }
    return;
  }
  __assert_fail("minv && maxv",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x2cd,"void flatbuffers::rust::RustGenerator::GenEnum(const EnumDef &)");
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    const bool is_private = parser_.opts.no_leak_private_annotations &&
                            (enum_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("BASE_TYPE", GetEnumTypeForDecl(enum_def.underlying_type));
    code_.SetValue("ENUM_NAMESPACE", namer_.Namespace(enum_def.name));
    code_.SetValue("ENUM_CONSTANT", namer_.Constant(enum_def.name));
    const EnumVal *minv = enum_def.MinValue();
    const EnumVal *maxv = enum_def.MaxValue();
    FLATBUFFERS_ASSERT(minv && maxv);
    code_.SetValue("ENUM_MIN_BASE_VALUE", enum_def.ToString(*minv));
    code_.SetValue("ENUM_MAX_BASE_VALUE", enum_def.ToString(*maxv));

    if (IsBitFlagsEnum(enum_def)) {
      // Defer to the convenient and canonical bitflags crate. We declare it in
      // a module to #allow camel case constants in a smaller scope. This
      // matches Flatbuffers c-modeled enums where variants are associated
      // constants but in camel case.
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "mod bitflags_{{ENUM_NAMESPACE}} {";
      code_ += "  flatbuffers::bitflags::bitflags! {";
      GenComment(enum_def.doc_comment, "    ");
      code_ += "    #[derive(Default, Debug, Clone, Copy, PartialEq)]";
      code_ += "    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment, "    ");
        code_ += "    const {{VARIANT}} = {{VALUE}};";
      });
      code_ += "    }";
      code_ += "  }";
      code_ += "}";
      code_ += "pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};";
      code_ += "";

      code_.SetValue("INTO_BASE", "self.bits()");
    } else {
      // Normal, c-modelled enums.
      // Deprecated associated constants;
      const std::string deprecation_warning =
          "#[deprecated(since = \"2.0.0\", note = \"Use associated constants"
          " instead. This will no longer be generated in 2021.\")]";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MIN_BASE_VALUE}};";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MAX_BASE_VALUE}};";
      auto num_fields = NumToString(enum_def.size());
      code_ += deprecation_warning;
      code_ += "#[allow(non_camel_case_types)]";
      code_ += "pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; " +
               num_fields + "] = [";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        code_ += namer_.EnumVariant(enum_def, ev) + ",";
      });
      code_ += "];";
      code_ += "";

      GenComment(enum_def.doc_comment);
      // Derive Default to be 0. flatc enforces this when the enum
      // is put into a struct, though this isn't documented behavior, it is
      // needed to derive defaults in struct objects.
      code_ +=
          "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, "
          "Default)]";
      code_ += "#[repr(transparent)]";
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});";
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "impl {{ENUM_TY}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment);
        code_ += "pub const {{VARIANT}}: Self = Self({{VALUE}});";
      });
      code_ += "";
      // Generate Associated constants
      code_ += "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};";
      code_ += "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};";
      code_ += "  pub const ENUM_VALUES: &'static [Self] = &[";
      ForAllEnumValues(enum_def, [&]() { code_ += "  Self::{{VARIANT}},"; });
      code_ += "  ];";
      code_ += "  /// Returns the variant's name or \"\" if unknown.";
      code_ += "  pub fn variant_name(self) -> Option<&'static str> {";
      code_ += "    match self {";
      ForAllEnumValues(enum_def, [&]() {
        code_ += "    Self::{{VARIANT}} => Some(\"{{VARIANT}}\"),";
      });
      code_ += "      _ => None,";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      // Generate Debug. Unknown variants are printed like "<UNKNOWN 42>".
      code_ += "impl core::fmt::Debug for {{ENUM_TY}} {";
      code_ +=
          "  fn fmt(&self, f: &mut core::fmt::Formatter) ->"
          " core::fmt::Result {";
      code_ += "    if let Some(name) = self.variant_name() {";
      code_ += "      f.write_str(name)";
      code_ += "    } else {";
      code_ += "      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_.SetValue("INTO_BASE", "self.0");
    }

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      code_ += "impl Serialize for {{ENUM_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (IsBitFlagsEnum(enum_def)) {
        code_ += "    serializer.serialize_u32(self.bits() as u32)";
      } else {
        code_ +=
            "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 "
            "as "
            "u32, self.variant_name().unwrap())";
      }
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate Follow and Push so we can serialize and stuff.
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{ENUM_TY}} {";
    code_ += "  type Inner = Self;";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ +=
        "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);";
    if (IsBitFlagsEnum(enum_def)) {
      code_ += "    Self::from_bits_retain(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::Push for {{ENUM_TY}} {";
    code_ += "    type Output = {{ENUM_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, "
        "{{INTO_BASE}});";
    code_ += "    }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::EndianScalar for {{ENUM_TY}} {";
    code_ += "  type Scalar = {{BASE_TYPE}};";
    code_ += "  #[inline]";
    code_ += "  fn to_little_endian(self) -> {{BASE_TYPE}} {";
    code_ += "    {{INTO_BASE}}.to_le()";
    code_ += "  }";
    code_ += "  #[inline]";
    code_ += "  #[allow(clippy::wrong_self_convention)]";
    code_ += "  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {";
    code_ += "    let b = {{BASE_TYPE}}::from_le(v);";
    if (IsBitFlagsEnum(enum_def)) {
      code_ += "    Self::from_bits_retain(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate verifier - deferring to the base type.
    code_ += "impl<'a> flatbuffers::Verifiable for {{ENUM_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    {{BASE_TYPE}}::run_verifier(v, pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";
    // Enums are basically integers.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}";

    if (enum_def.is_union) {
      // Generate typesafe offset(s) for unions
      code_.SetValue("UNION_TYPE", namer_.Type(enum_def));
      code_ += "{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}";
      code_ += "";
      if (parser_.opts.generate_object_based_api) { GenUnionObject(enum_def); }
    }
  }